

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t ustrcase_map_63(int32_t caseLocale,uint32_t options,BreakIterator *iter,UChar *dest,
                       int32_t destCapacity,UChar *src,int32_t srcLength,
                       UStringCaseMapper *stringCaseMapper,Edits *edits,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t length;
  int32_t destLength;
  UChar *src_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  BreakIterator *iter_local;
  uint32_t options_local;
  int32_t caseLocale_local;
  
  UVar1 = U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((destCapacity < 0) ||
       ((((dest == (UChar *)0x0 && (0 < destCapacity)) || (src == (UChar *)0x0)) || (srcLength < -1)
        ))) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      options_local = 0;
    }
    else {
      if (srcLength == -1) {
        srcLength = u_strlen_63(src);
      }
      if ((dest == (UChar *)0x0) ||
         (((src < dest || (dest + destCapacity <= src)) &&
          ((dest < src || (src + srcLength <= dest)))))) {
        if ((edits != (Edits *)0x0) && ((options & 0x2000) == 0)) {
          icu_63::Edits::reset(edits);
        }
        length = (*stringCaseMapper)(caseLocale,options,iter,dest,destCapacity,src,srcLength,edits,
                                     errorCode);
        options_local = u_terminateUChars_63(dest,destCapacity,length,errorCode);
      }
      else {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        options_local = 0;
      }
    }
  }
  else {
    options_local = 0;
  }
  return options_local;
}

Assistant:

U_CFUNC int32_t
ustrcase_map(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_PARAM
             UChar *dest, int32_t destCapacity,
             const UChar *src, int32_t srcLength,
             UStringCaseMapper *stringCaseMapper,
             icu::Edits *edits,
             UErrorCode &errorCode) {
    int32_t destLength;

    /* check argument values */
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if( destCapacity<0 ||
        (dest==NULL && destCapacity>0) ||
        src==NULL ||
        srcLength<-1
    ) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* get the string length */
    if(srcLength==-1) {
        srcLength=u_strlen(src);
    }

    /* check for overlapping source and destination */
    if( dest!=NULL &&
        ((src>=dest && src<(dest+destCapacity)) ||
         (dest>=src && dest<(src+srcLength)))
    ) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if (edits != nullptr && (options & U_EDITS_NO_RESET) == 0) {
        edits->reset();
    }
    destLength=stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                                dest, destCapacity, src, srcLength, edits, errorCode);
    return u_terminateUChars(dest, destCapacity, destLength, &errorCode);
}